

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

int memReadPeak(void)

{
  int iVar1;
  bool bVar2;
  int local_12c;
  FILE *pFStack_128;
  int peak_kb;
  FILE *in;
  char local_118 [4];
  pid_t pid;
  char name [256];
  int local_c;
  
  in._4_4_ = getpid();
  sprintf(local_118,"/proc/%d/status",(ulong)in._4_4_);
  pFStack_128 = fopen(local_118,"rb");
  if (pFStack_128 == (FILE *)0x0) {
    local_c = 0;
  }
  else {
    local_12c = 0;
    while( true ) {
      iVar1 = feof(pFStack_128);
      bVar2 = false;
      if (iVar1 == 0) {
        iVar1 = __isoc99_fscanf(pFStack_128,"VmPeak: %d kB",&local_12c);
        bVar2 = iVar1 != 1;
      }
      if (!bVar2) break;
      do {
        iVar1 = feof(pFStack_128);
        bVar2 = false;
        if (iVar1 == 0) {
          iVar1 = fgetc(pFStack_128);
          bVar2 = iVar1 != 10;
        }
      } while (bVar2);
    }
    fclose(pFStack_128);
    local_c = local_12c;
  }
  return local_c;
}

Assistant:

static inline int memReadPeak(void)
{
    char  name[256];
    pid_t pid = getpid();

    sprintf(name, "/proc/%d/status", pid);
    FILE* in = fopen(name, "rb");
    if (in == NULL) return 0;

    // Find the correct line, beginning with "VmPeak:":
    int peak_kb = 0;
    while (!feof(in) && fscanf(in, "VmPeak: %d kB", &peak_kb) != 1)
        while (!feof(in) && fgetc(in) != '\n')
            ;
    fclose(in);

    return peak_kb;
}